

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

_Bool SaveStorageValue(uint position,int value)

{
  _Bool _Var1;
  uchar *puVar2;
  uchar *puVar3;
  ulong uVar4;
  uint uVar5;
  int *dataPtr;
  uint dataSize;
  char local_238 [520];
  
  memset(local_238 + 0xd,0,499);
  builtin_strncpy(local_238,"storage.data",0xd);
  dataSize = 0;
  puVar2 = LoadFileData(local_238,&dataSize);
  if (puVar2 == (uchar *)0x0) {
    TraceLog(3,"FILEIO: [%s] File not found, creating it",local_238);
    uVar5 = position * 4 + 4;
    dataSize = uVar5;
    puVar2 = (uchar *)malloc((ulong)uVar5);
    *(int *)(puVar2 + (ulong)position * 4) = value;
    _Var1 = SaveFileData(local_238,puVar2,uVar5);
    UnloadFileData(puVar2);
  }
  else {
    uVar4 = (ulong)position;
    if (uVar4 * 4 < (ulong)dataSize) {
      *(int *)(puVar2 + uVar4 * 4) = value;
      uVar5 = dataSize;
    }
    else {
      uVar5 = position * 4 + 4;
      puVar3 = (uchar *)realloc(puVar2,(ulong)uVar5);
      if (puVar3 == (uchar *)0x0) {
        TraceLog(4,
                 "FILEIO: [%s] Failed to realloc data (%u), position in bytes (%u) bigger than actual file size"
                 ,local_238,(ulong)dataSize,uVar4 * 4);
        uVar5 = dataSize;
      }
      else {
        *(int *)(puVar3 + uVar4 * 4) = value;
        puVar2 = puVar3;
      }
    }
    _Var1 = SaveFileData(local_238,puVar2,uVar5);
    free(puVar2);
  }
  return _Var1;
}

Assistant:

bool SaveStorageValue(unsigned int position, int value)
{
    bool success = false;

#if defined(SUPPORT_DATA_STORAGE)
    char path[512] = { 0 };
#if defined(PLATFORM_ANDROID)
    strcpy(path, CORE.Android.internalDataPath);
    strcat(path, "/");
    strcat(path, STORAGE_DATA_FILE);
#elif defined(PLATFORM_UWP)
    strcpy(path, CORE.UWP.internalDataPath);
    strcat(path, "/");
    strcat(path, STORAGE_DATA_FILE);
#else
    strcpy(path, STORAGE_DATA_FILE);
#endif

    unsigned int dataSize = 0;
    unsigned int newDataSize = 0;
    unsigned char *fileData = LoadFileData(path, &dataSize);
    unsigned char *newFileData = NULL;

    if (fileData != NULL)
    {
        if (dataSize <= (position*sizeof(int)))
        {
            // Increase data size up to position and store value
            newDataSize = (position + 1)*sizeof(int);
            newFileData = (unsigned char *)RL_REALLOC(fileData, newDataSize);

            if (newFileData != NULL)
            {
                // RL_REALLOC succeded
                int *dataPtr = (int *)newFileData;
                dataPtr[position] = value;
            }
            else
            {
                // RL_REALLOC failed
                TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to realloc data (%u), position in bytes (%u) bigger than actual file size", path, dataSize, position*sizeof(int));

                // We store the old size of the file
                newFileData = fileData;
                newDataSize = dataSize;
            }
        }
        else
        {
            // Store the old size of the file
            newFileData = fileData;
            newDataSize = dataSize;

            // Replace value on selected position
            int *dataPtr = (int *)newFileData;
            dataPtr[position] = value;
        }

        success = SaveFileData(path, newFileData, newDataSize);
        RL_FREE(newFileData);
    }
    else
    {
        TRACELOG(LOG_INFO, "FILEIO: [%s] File not found, creating it", path);

        dataSize = (position + 1)*sizeof(int);
        fileData = (unsigned char *)RL_MALLOC(dataSize);
        int *dataPtr = (int *)fileData;
        dataPtr[position] = value;

        success = SaveFileData(path, fileData, dataSize);
        UnloadFileData(fileData);
    }
#endif

    return success;
}